

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

KNearestNeighborsClassifier *
buildBasicNearestNeighborClassifier
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,char *outTensorName)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *this;
  KNearestNeighborsClassifier *this_00;
  Int64Parameter *pIVar4;
  Int64Set *this_01;
  NearestNeighborsIndex *this_02;
  SingleKdTreeIndex *pSVar5;
  FloatVector *pFVar6;
  StringVector *pSVar7;
  int i;
  int iVar8;
  undefined7 in_register_00000031;
  allocator<char> local_55;
  undefined4 local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_54 = (undefined4)CONCAT71(in_register_00000031,isUpdatable);
  pMVar1 = CoreML::Specification::Model::mutable_description(m);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar1->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,inTensorAttr->name);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  this->datatype_ = 0x10020;
  for (iVar8 = 0; iVar8 < inTensorAttr->dimension; iVar8 = iVar8 + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  }
  pMVar1 = CoreML::Specification::Model::mutable_description(m);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar1->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,outTensorName);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar3);
  pMVar1 = CoreML::Specification::Model::mutable_description(m);
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar1,outTensorName);
  m->specificationversion_ = 4;
  this_00 = CoreML::Specification::Model::mutable_knearestneighborsclassifier(m);
  pIVar4 = CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors(this_00);
  this_01 = CoreML::Specification::Int64Parameter::mutable_set(pIVar4);
  CoreML::Specification::Int64Set::add_values(this_01,3);
  pIVar4 = CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors(this_00);
  pIVar4->defaultvalue_ = 3;
  this_02 = CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex
                      (this_00);
  pSVar5 = CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex(this_02);
  pSVar5->leafsize_ = 0x1e;
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance(this_02);
  this_02->numberofdimensions_ = inTensorAttr->dimension;
  pFVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::Add
                     (&this_02->floatsamples_);
  for (iVar8 = 0; iVar8 < inTensorAttr->dimension; iVar8 = iVar8 + 1) {
    local_50._M_dataplus._M_p._0_4_ = (float)iVar8;
    google::protobuf::RepeatedField<float>::Add(&pFVar6->vector_,(float *)&local_50);
  }
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting(this_00);
  pSVar7 = CoreML::Specification::KNearestNeighborsClassifier::mutable_stringclasslabels(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"zero",&local_55);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Add(&pSVar7->vector_,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if ((char)local_54 != '\0') {
    m->isupdatable_ = true;
  }
  return this_00;
}

Assistant:

Specification::KNearestNeighborsClassifier* buildBasicNearestNeighborClassifier(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const char *outTensorName) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorName);
    outTensor->mutable_type()->mutable_stringtype();
    
    m.mutable_description()->set_predictedfeaturename(outTensorName);
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto nearestNeighborClassifier = m.mutable_knearestneighborsclassifier();
    int numberOfNeighbors = 3;
    nearestNeighborClassifier->mutable_numberofneighbors()->mutable_set()->add_values(numberOfNeighbors);
    nearestNeighborClassifier->mutable_numberofneighbors()->set_defaultvalue(numberOfNeighbors);

    auto nearestNeighborIndex = nearestNeighborClassifier->mutable_nearestneighborsindex();
    
    nearestNeighborIndex->mutable_singlekdtreeindex()->set_leafsize(30);
    nearestNeighborIndex->mutable_squaredeuclideandistance();
    
    nearestNeighborIndex->set_numberofdimensions(inTensorAttr->dimension);
    
    auto floatVector = nearestNeighborIndex->add_floatsamples();
    auto pointVector = floatVector->mutable_vector();
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        pointVector->Add((float)i);
    }
    
    nearestNeighborClassifier->mutable_uniformweighting();
    nearestNeighborClassifier->mutable_stringclasslabels()->add_vector(std::string("zero"));
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return nearestNeighborClassifier;
}